

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  uv_write_t *req;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  int64_t local_18;
  
  if (nread < 0) {
    local_18 = eval_a;
    eval_a = nread;
    if (nread == -0xfff) {
      puts("got EOF");
      free(buf->base);
      uv_close((uv_handle_t *)stream,ponger_on_close);
      return;
    }
    pcVar6 = "UV_EOF";
    pcVar4 = "nread";
    uVar3 = 0xa9;
    lVar2 = -0xfff;
  }
  else {
    for (lVar2 = 0; pcVar4 = buf->base, nread != lVar2; lVar2 = lVar2 + 1) {
      if (pcVar4[lVar2] == 'I') {
        pcVar4[lVar2] = 'O';
      }
    }
    _eval_a = uv_buf_init(pcVar4,(uint)nread);
    req = (uv_write_t *)malloc(0xc0);
    if (req == (uv_write_t *)0x0) {
      pcVar5 = "!=";
      lVar2 = 0;
      pcVar7 = "!=";
      nread = 0;
      pcVar6 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar4 = "req";
      uVar3 = 0xbb;
      goto LAB_0014302e;
    }
    iVar1 = uv_write(req,stream,(uv_buf_t *)&eval_a,1,pinger_after_write);
    lVar2 = (long)iVar1;
    if (lVar2 == 0) {
      return;
    }
    pcVar6 = "uv_write(req, stream, &writebuf, 1, pinger_after_write)";
    pcVar4 = "0";
    uVar3 = 0xbc;
    nread = 0;
  }
  pcVar7 = "==";
  pcVar5 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0014302e:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ping-pong.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,nread,pcVar7,lVar2);
  abort();
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  ASSERT_EQ(0, uv_write(req, stream, &writebuf, 1, pinger_after_write));
}